

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_type.hpp
# Opt level: O1

void duckdb::Bit::RightShift(bitstring_t *bit_string,idx_t shift,bitstring_t *result)

{
  char *pcVar1;
  ulong uVar2;
  char *pcVar3;
  byte *pbVar4;
  ulong uVar5;
  byte bVar6;
  char *pcVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  byte bVar11;
  undefined8 local_40;
  byte *local_38;
  
  pcVar1 = (result->value).pointer.prefix;
  pcVar3 = pcVar1;
  if (0xc < (result->value).pointer.length) {
    pcVar3 = (result->value).pointer.ptr;
  }
  if ((bit_string->value).pointer.length < 0xd) {
    pcVar7 = (bit_string->value).pointer.prefix;
  }
  else {
    pcVar7 = (bit_string->value).pointer.ptr;
  }
  *pcVar3 = *pcVar7;
  pcVar3 = pcVar1;
  if (0xc < (result->value).pointer.length) {
    pcVar3 = (result->value).pointer.ptr;
  }
  uVar8 = (ulong)(byte)*pcVar3;
  iVar9 = -(int)shift;
  lVar10 = -shift;
  uVar5 = 0;
  while( true ) {
    uVar2 = *(ulong *)&result->value;
    pcVar3 = (result->value).pointer.ptr;
    if ((uint)uVar2 < 0xd) {
      bVar11 = (byte)(uVar2 >> 0x20);
    }
    else {
      bVar11 = *pcVar3;
    }
    if (((uVar2 & 0xffffffff) * 8 - (ulong)bVar11) - 8 <= uVar5) break;
    if (uVar5 < shift) {
      if ((result->value).pointer.length < 0xd) {
        pcVar3 = pcVar1;
      }
      bVar11 = ~(byte)uVar8 & 7;
      pcVar3[(uVar8 >> 3) + 1] = pcVar3[(uVar8 >> 3) + 1] & (-2 << bVar11 | 0xfeU >> 8 - bVar11);
    }
    else {
      local_40 = *(undefined8 *)&bit_string->value;
      local_38 = (byte *)(bit_string->value).pointer.ptr;
      if ((uint)local_40 < 0xd) {
        bVar11 = (byte)((ulong)local_40 >> 0x20);
      }
      else {
        bVar11 = *local_38;
      }
      pbVar4 = local_38;
      if ((uint)local_40 < 0xd) {
        pbVar4 = (byte *)((long)&local_40 + 4);
      }
      if ((result->value).pointer.length < 0xd) {
        pcVar3 = pcVar1;
      }
      bVar6 = '\x01' << (~(byte)uVar8 & 7);
      if ((pbVar4[(lVar10 + (ulong)bVar11 >> 3) + 1] >> (~(bVar11 + (char)iVar9) & 7) & 1) == 0) {
        pcVar3[(uVar8 >> 3) + 1] = pcVar3[(uVar8 >> 3) + 1] & ~bVar6;
      }
      else {
        pcVar3[(uVar8 >> 3) + 1] = pcVar3[(uVar8 >> 3) + 1] | bVar6;
      }
    }
    uVar5 = uVar5 + 1;
    iVar9 = iVar9 + 1;
    lVar10 = lVar10 + 1;
    uVar8 = uVar8 + 1;
  }
  Finalize(result);
  return;
}

Assistant:

char *GetDataWriteable() const {
		return IsInlined() ? (char *)value.inlined.inlined : value.pointer.ptr; // NOLINT
	}